

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O0

PktOut * ssh2_portfwd_chanopen
                   (ssh2_connection_state *s,ssh2_channel *c,char *hostname,int port,
                   char *description,SocketPeerInfo *pi)

{
  LogContext *pLVar1;
  char *pcVar2;
  PktOut *pPVar3;
  int local_74;
  char *local_68;
  PktOut *pktout;
  PacketProtocolLayer *ppl;
  SocketPeerInfo *pi_local;
  char *description_local;
  int port_local;
  char *hostname_local;
  ssh2_channel *c_local;
  ssh2_connection_state *s_local;
  
  if ((pi == (SocketPeerInfo *)0x0) || (pi->log_text == (char *)0x0)) {
    pLVar1 = (s->ppl).logctx;
    pcVar2 = dupprintf("Forwarding connection to listening port %s:%d",hostname,(ulong)(uint)port);
    logevent_and_free(pLVar1,pcVar2);
  }
  else {
    pLVar1 = (s->ppl).logctx;
    pcVar2 = dupprintf("Forwarding connection to listening port %s:%d from %s",hostname,
                       (ulong)(uint)port,pi->log_text);
    logevent_and_free(pLVar1,pcVar2);
  }
  pPVar3 = ssh2_chanopen_init(c,"forwarded-tcpip");
  BinarySink_put_stringz(pPVar3->binarysink_,hostname);
  BinarySink_put_uint32(pPVar3->binarysink_,(long)port);
  if ((pi == (SocketPeerInfo *)0x0) || (pi->addr_text == (char *)0x0)) {
    local_68 = "0.0.0.0";
  }
  else {
    local_68 = pi->addr_text;
  }
  BinarySink_put_stringz(pPVar3->binarysink_,local_68);
  if ((pi == (SocketPeerInfo *)0x0) || (pi->port < 0)) {
    local_74 = 0;
  }
  else {
    local_74 = pi->port;
  }
  BinarySink_put_uint32(pPVar3->binarysink_,(long)local_74);
  return pPVar3;
}

Assistant:

PktOut *ssh2_portfwd_chanopen(
    struct ssh2_connection_state *s, struct ssh2_channel *c,
    const char *hostname, int port,
    const char *description, const SocketPeerInfo *pi)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktOut *pktout;

    /*
     * In server mode, this function is called by portfwdmgr in
     * response to PortListeners that were set up by calling
     * portfwdmgr_listen, which means that the hostname and port
     * parameters will identify the listening socket on which a
     * connection just came in.
     */

    if (pi && pi->log_text)
        ppl_logevent("Forwarding connection to listening port %s:%d from %s",
                     hostname, port, pi->log_text);
    else
        ppl_logevent("Forwarding connection to listening port %s:%d",
                     hostname, port);

    pktout = ssh2_chanopen_init(c, "forwarded-tcpip");
    put_stringz(pktout, hostname);
    put_uint32(pktout, port);
    put_stringz(pktout, (pi && pi->addr_text ? pi->addr_text : "0.0.0.0"));
    put_uint32(pktout, (pi && pi->port >= 0 ? pi->port : 0));

    return pktout;
}